

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cc
# Opt level: O1

bool __thiscall raptor::Client::Connect(Client *this,char *addr,size_t timeout_ms)

{
  raptor_error e;
  undefined1 local_30 [24];
  IProtocol local_18 [2];
  
  TcpClient::Connect((TcpClient *)local_30,(char *)this->_impl,(size_t)addr);
  if ((Status *)local_30._0_8_ != (Status *)0x0) {
    Status::ToString_abi_cxx11_((string *)(local_30 + 8),(Status *)local_30._0_8_);
    LogFormatPrint("/workspace/llm4binary/github/license_all_cmakelists_1510/shadow-yuan[P]raptor/surface/client.cc"
                   ,0x36,kLogLevelError,"client: connect (%s)",local_30._8_8_);
    if ((IProtocol *)local_30._8_8_ != local_18) {
      operator_delete((void *)local_30._8_8_);
    }
  }
  RefCountedPtr<raptor::Status>::~RefCountedPtr((RefCountedPtr<raptor::Status> *)local_30);
  return (Status *)local_30._0_8_ == (Status *)0x0;
}

Assistant:

bool Client::Connect(const char* addr, size_t timeout_ms) {
    raptor_error e = _impl->Connect(addr, timeout_ms);
    if (e != RAPTOR_ERROR_NONE) {
        log_error("client: connect (%s)", e->ToString().c_str());
        return false;
    }
    return true;
}